

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

int __thiscall
cmCTestCoverageHandler::RunBullseyeSourceSummary
          (cmCTestCoverageHandler *this,cmCTestCoverageHandlerContainer *cont)

{
  cmCTest *pcVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  ostream *poVar8;
  long lVar9;
  undefined4 uVar10;
  allocator<char> local_871;
  int local_870;
  int functionsCalled;
  ostream *local_868;
  int branchCovered;
  string file;
  float local_834;
  int local_830;
  float cper;
  int percentBranch;
  int totalBranches;
  int percentFunction;
  int totalFunctions;
  string shortFileName;
  double total_functions;
  double total_untested;
  double total_tested;
  float local_7dc;
  string local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7b8;
  cmXMLWriter xml;
  undefined1 local_758 [16];
  double local_748;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coveredFilesFullPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coveredFiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coveredFileNames;
  string outputFile;
  string stdline;
  string sourceFile;
  string coverage_start_time;
  string errline;
  string end_time;
  ifstream fin;
  byte abStack_480 [488];
  cmGeneratedFileStream covSumFile;
  
  outputFile._M_dataplus._M_p = (pointer)&outputFile.field_2;
  outputFile._M_string_length = 0;
  outputFile.field_2._M_local_buf[0] = '\0';
  iVar6 = RunBullseyeCommand(this,cont,"covsrc","-c",&outputFile);
  if (iVar6 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&covSumFile);
    std::operator<<((ostream *)&covSumFile,"error running covsrc:\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    iVar6 = 0;
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x770,_fin,false);
    std::__cxx11::string::~string((string *)&fin);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&covSumFile);
  }
  else {
    poVar8 = cont->OFS;
    cmGeneratedFileStream::cmGeneratedFileStream(&covSumFile,None);
    cmXMLWriter::cmXMLWriter(&xml,(ostream *)&covSumFile,0);
    bVar5 = cmCTestGenericHandler::StartResultingXML
                      (&this->super_cmCTestGenericHandler,PartCoverage,"Coverage",&covSumFile);
    if (bVar5) {
      cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,&xml,
                        (this->super_cmCTestGenericHandler).AppendXML);
      lVar7 = std::chrono::_V2::steady_clock::now();
      cmCTest::CurrentTime_abi_cxx11_
                (&coverage_start_time,(this->super_cmCTestGenericHandler).CTest);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fin,"Coverage",(allocator<char> *)&end_time);
      cmXMLWriter::StartElement(&xml,(string *)&fin);
      std::__cxx11::string::~string((string *)&fin);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fin,"StartDateTime",(allocator<char> *)&end_time);
      cmXMLWriter::Element<std::__cxx11::string>(&xml,(string *)&fin,&coverage_start_time);
      std::__cxx11::string::~string((string *)&fin);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fin,"StartTime",(allocator<char> *)&coveredFileNames);
      end_time._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
      cmXMLWriter::
      Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                (&xml,(string *)&fin,
                 (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&end_time);
      std::__cxx11::string::~string((string *)&fin);
      stdline._M_dataplus._M_p = (pointer)&stdline.field_2;
      stdline._M_string_length = 0;
      errline._M_dataplus._M_p = (pointer)&errline.field_2;
      errline._M_string_length = 0;
      sourceFile._M_dataplus._M_p = (pointer)&sourceFile.field_2;
      sourceFile._M_string_length = 0;
      functionsCalled = 0;
      totalFunctions = 0;
      percentFunction = 0;
      branchCovered = 0;
      totalBranches = 0;
      percentBranch = 0;
      total_tested = 0.0;
      total_untested = 0.0;
      stdline.field_2._M_local_buf[0] = '\0';
      total_functions = 0.0;
      errline.field_2._M_local_buf[0] = '\0';
      sourceFile.field_2._M_local_buf[0] = '\0';
      coveredFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      coveredFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      coveredFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      coveredFilesFullPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      coveredFilesFullPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      coveredFilesFullPath.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::ifstream::ifstream(&fin,outputFile._M_dataplus._M_p,_S_in);
      if ((abStack_480[*(long *)(_fin + -0x18)] & 5) == 0) {
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header;
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_7b8 = &cont->BinaryDir;
        local_758 = ZEXT816(0);
        local_748 = 0.0;
        local_868 = poVar8;
        coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             coveredFileNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          bVar5 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&fin,&stdline,(bool *)0x0,0xffffffffffffffff);
          if (!bVar5) break;
          if (stdline._M_string_length != 0) {
            ParseBullsEyeCovsrcLine
                      (this,&stdline,&sourceFile,&functionsCalled,&totalFunctions,&percentFunction,
                       &branchCovered,&totalBranches,&percentBranch);
            bVar5 = std::operator==(&sourceFile,"Source");
            if (!bVar5) {
              bVar5 = std::operator==(&sourceFile,"Total");
              if (!bVar5) {
                std::__cxx11::string::string((string *)&file,(string *)&sourceFile);
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&coveredFileNames,&file);
                bVar5 = cmsys::SystemTools::FileIsFullPath(&sourceFile);
                if (!bVar5) {
                  shortFileName._M_dataplus._M_p._0_1_ = 0x2f;
                  cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&>
                            (&end_time,local_7b8,(char *)&shortFileName,&sourceFile);
                  std::__cxx11::string::operator=((string *)&file,(string *)&end_time);
                  std::__cxx11::string::~string((string *)&end_time);
                }
                cmsys::SystemTools::CollapseFullPath(&end_time,&file);
                std::__cxx11::string::operator=((string *)&file,(string *)&end_time);
                std::__cxx11::string::~string((string *)&end_time);
                bVar5 = ShouldIDoCoverage(this,&file,&cont->SourceDir,local_7b8);
                if (bVar5) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&end_time);
                  poVar8 = std::operator<<((ostream *)&end_time,"Doing coverage for: ");
                  poVar8 = std::operator<<(poVar8,(string *)&file);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x7c0,shortFileName._M_dataplus._M_p,
                               (this->super_cmCTestGenericHandler).Quiet);
                  std::__cxx11::string::~string((string *)&shortFileName);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&end_time);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&coveredFiles,&sourceFile);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&coveredFilesFullPath,&file);
                  iVar4 = totalFunctions;
                  total_functions = (double)totalFunctions + total_functions;
                  total_tested = (double)functionsCalled + total_tested;
                  local_748 = local_748 + 1.0;
                  total_untested = (double)(totalFunctions - functionsCalled) + total_untested;
                  cmsys::SystemTools::GetFilenameName(&end_time,&file);
                  cmCTest::GetShortPathToFile
                            (&shortFileName,(this->super_cmCTestGenericHandler).CTest,&file);
                  iVar3 = percentFunction;
                  iVar6 = percentBranch;
                  cper = (float)(percentBranch + percentFunction);
                  local_830 = totalBranches;
                  if (0 < totalBranches) {
                    cper = cper * 0.5;
                  }
                  local_834 = cper / 100.0;
                  local_7dc = cper;
                  poVar8 = std::operator<<(local_868,(string *)&stdline);
                  std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(local_868,(string *)&end_time);
                  std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(local_868,"functionsCalled: ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,functionsCalled / 100);
                  std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(local_868,"totalFunctions: ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar4 / 100);
                  std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(local_868,"percentFunction: ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
                  std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(local_868,"branchCovered: ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,branchCovered);
                  std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(local_868,"totalBranches: ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_830);
                  std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(local_868,"percentBranch: ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
                  std::operator<<(poVar8,"\n");
                  std::operator<<(local_868,"percentCoverage: ");
                  uVar10 = local_758._12_4_;
                  dVar2 = local_758._0_8_ + (double)local_7dc;
                  local_758._8_4_ = local_758._8_4_;
                  local_758._0_8_ = dVar2;
                  local_758._12_4_ = uVar10;
                  poVar8 = std::ostream::_M_insert<double>(dVar2);
                  std::operator<<(poVar8,"\n");
                  poVar8 = std::operator<<(local_868,"coverage metric: ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_834);
                  std::operator<<(poVar8,"\n");
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7d8,"File",(allocator<char> *)&local_870);
                  cmXMLWriter::StartElement(&xml,&local_7d8);
                  std::__cxx11::string::~string((string *)&local_7d8);
                  cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"Name",&sourceFile);
                  cmXMLWriter::Attribute<std::__cxx11::string>(&xml,"FullPath",&shortFileName);
                  local_7d8._M_dataplus._M_p = "false";
                  if (0.0 < local_834) {
                    local_7d8._M_dataplus._M_p = "true";
                  }
                  cmXMLWriter::Attribute<char_const*>(&xml,"Covered",(char **)&local_7d8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7d8,"BranchesTested",(allocator<char> *)&local_870);
                  cmXMLWriter::Element<int>(&xml,&local_7d8,&branchCovered);
                  std::__cxx11::string::~string((string *)&local_7d8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7d8,"BranchesUnTested",&local_871);
                  local_870 = local_830 - branchCovered;
                  cmXMLWriter::Element<int>(&xml,&local_7d8,&local_870);
                  std::__cxx11::string::~string((string *)&local_7d8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7d8,"FunctionsTested",(allocator<char> *)&local_870);
                  cmXMLWriter::Element<int>(&xml,&local_7d8,&functionsCalled);
                  std::__cxx11::string::~string((string *)&local_7d8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7d8,"FunctionsUnTested",&local_871);
                  local_870 = iVar4 - functionsCalled;
                  cmXMLWriter::Element<int>(&xml,&local_7d8,&local_870);
                  std::__cxx11::string::~string((string *)&local_7d8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7d8,"LOCTested",&local_871);
                  local_870 = functionsCalled * 100;
                  cmXMLWriter::Element<int>(&xml,&local_7d8,&local_870);
                  std::__cxx11::string::~string((string *)&local_7d8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7d8,"LOCUnTested",&local_871);
                  local_870 = (iVar4 - functionsCalled) * 100;
                  cmXMLWriter::Element<int>(&xml,&local_7d8,&local_870);
                  std::__cxx11::string::~string((string *)&local_7d8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7d8,"PercentCoverage",(allocator<char> *)&local_870);
                  cmXMLWriter::Element<float>(&xml,&local_7d8,&cper);
                  std::__cxx11::string::~string((string *)&local_7d8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_7d8,"CoverageMetric",(allocator<char> *)&local_870);
                  cmXMLWriter::Element<float>(&xml,&local_7d8,&local_834);
                  std::__cxx11::string::~string((string *)&local_7d8);
                  WriteXMLLabels(this,&xml,&shortFileName);
                  cmXMLWriter::EndElement(&xml);
                  std::__cxx11::string::~string((string *)&shortFileName);
                  std::__cxx11::string::~string((string *)&end_time);
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&end_time);
                  poVar8 = std::operator<<((ostream *)&end_time,
                                           ".NoDartCoverage found, so skip coverage check for: ");
                  poVar8 = std::operator<<(poVar8,(string *)&file);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                  std::__cxx11::stringbuf::str();
                  cmCTest::Log(pcVar1,5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                               ,0x7ba,shortFileName._M_dataplus._M_p,
                               (this->super_cmCTestGenericHandler).Quiet);
                  std::__cxx11::string::~string((string *)&shortFileName);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&end_time);
                }
                std::__cxx11::string::~string((string *)&file);
              }
            }
          }
        }
        cmCTest::CurrentTime_abi_cxx11_(&end_time,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,"LOCTested",(allocator<char> *)&shortFileName);
        cmXMLWriter::Element<double>(&xml,&file,&total_tested);
        std::__cxx11::string::~string((string *)&file);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,"LOCUntested",(allocator<char> *)&shortFileName);
        cmXMLWriter::Element<double>(&xml,&file,&total_untested);
        std::__cxx11::string::~string((string *)&file);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,"LOC",(allocator<char> *)&shortFileName);
        cmXMLWriter::Element<double>(&xml,&file,&total_functions);
        std::__cxx11::string::~string((string *)&file);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,"PercentCoverage",(allocator<char> *)&local_7d8);
        shortFileName._M_dataplus._M_p =
             (pointer)(-(ulong)(local_748 != 0.0) & (ulong)(local_758._0_8_ / local_748));
        cmXMLWriter::Element<double>(&xml,&file,(double *)&shortFileName);
        std::__cxx11::string::~string((string *)&file);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,"EndDateTime",(allocator<char> *)&shortFileName);
        cmXMLWriter::Element<std::__cxx11::string>(&xml,&file,&end_time);
        std::__cxx11::string::~string((string *)&file);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,"EndTime",(allocator<char> *)&local_7d8);
        shortFileName._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
        cmXMLWriter::
        Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                  (&xml,&file,
                   (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)&shortFileName);
        std::__cxx11::string::~string((string *)&file);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&file,"ElapsedMinutes",(allocator<char> *)&local_7d8);
        lVar9 = std::chrono::_V2::steady_clock::now();
        shortFileName._M_dataplus._M_p = (pointer)((lVar9 - lVar7) / 60000000000);
        cmXMLWriter::Element<long>(&xml,&file,(long *)&shortFileName);
        std::__cxx11::string::~string((string *)&file);
        cmXMLWriter::EndElement(&xml);
        cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,&xml);
        iVar6 = RunBullseyeCoverageBranch
                          (this,cont,&coveredFileNames,&coveredFiles,&coveredFilesFullPath);
        std::__cxx11::string::~string((string *)&end_time);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&coveredFileNames._M_t);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&end_time);
        poVar8 = std::operator<<((ostream *)&end_time,"Cannot open coverage summary file: ");
        poVar8 = std::operator<<(poVar8,(string *)&outputFile);
        std::endl<char,std::char_traits<char>>(poVar8);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        iVar6 = 0;
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x79d,(char *)coveredFileNames._M_t._M_impl._0_8_,false);
        std::__cxx11::string::~string((string *)&coveredFileNames);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&end_time);
      }
      std::ifstream::~ifstream(&fin);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&coveredFilesFullPath);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&coveredFiles);
      std::__cxx11::string::~string((string *)&sourceFile);
      std::__cxx11::string::~string((string *)&errline);
      std::__cxx11::string::~string((string *)&stdline);
      std::__cxx11::string::~string((string *)&coverage_start_time);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fin);
      poVar8 = std::operator<<((ostream *)&fin,"Cannot open coverage summary file.");
      std::endl<char,std::char_traits<char>>(poVar8);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      iVar6 = 0;
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x77b,end_time._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&end_time);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fin);
    }
    cmXMLWriter::~cmXMLWriter(&xml);
    cmGeneratedFileStream::~cmGeneratedFileStream(&covSumFile);
  }
  std::__cxx11::string::~string((string *)&outputFile);
  return iVar6;
}

Assistant:

int cmCTestCoverageHandler::RunBullseyeSourceSummary(
  cmCTestCoverageHandlerContainer* cont)
{
  // Run the covsrc command and create a temp outputfile
  std::string outputFile;
  if (!this->RunBullseyeCommand(cont, "covsrc", "-c", outputFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "error running covsrc:\n");
    return 0;
  }

  std::ostream& tmpLog = *cont->OFS;
  // copen the Coverage.xml file in the Testing directory
  cmGeneratedFileStream covSumFile;
  cmXMLWriter xml(covSumFile);
  if (!this->StartResultingXML(cmCTest::PartCoverage, "Coverage",
                               covSumFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open coverage summary file." << std::endl);
    return 0;
  }
  this->CTest->StartXML(xml, this->AppendXML);
  auto elapsed_time_start = std::chrono::steady_clock::now();
  std::string coverage_start_time = this->CTest->CurrentTime();
  xml.StartElement("Coverage");
  xml.Element("StartDateTime", coverage_start_time);
  xml.Element("StartTime", std::chrono::system_clock::now());
  std::string stdline;
  std::string errline;
  // expected output:
  // first line is:
  // "Source","Function Coverage","out of","%","C/D Coverage","out of","%"
  // after that data follows in that format
  std::string sourceFile;
  int functionsCalled = 0;
  int totalFunctions = 0;
  int percentFunction = 0;
  int branchCovered = 0;
  int totalBranches = 0;
  int percentBranch = 0;
  double total_tested = 0;
  double total_untested = 0;
  double total_functions = 0;
  double percent_coverage = 0;
  double number_files = 0;
  std::vector<std::string> coveredFiles;
  std::vector<std::string> coveredFilesFullPath;
  // Read and parse the summary output file
  cmsys::ifstream fin(outputFile.c_str());
  if (!fin) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open coverage summary file: " << outputFile
                                                     << std::endl);
    return 0;
  }
  std::set<std::string> coveredFileNames;
  while (cmSystemTools::GetLineFromStream(fin, stdline)) {
    // if we have a line of output from stdout
    if (!stdline.empty()) {
      // parse the comma separated output
      this->ParseBullsEyeCovsrcLine(
        stdline, sourceFile, functionsCalled, totalFunctions, percentFunction,
        branchCovered, totalBranches, percentBranch);
      // The first line is the header
      if (sourceFile == "Source" || sourceFile == "Total") {
        continue;
      }
      std::string file = sourceFile;
      coveredFileNames.insert(file);
      if (!cmSystemTools::FileIsFullPath(sourceFile)) {
        // file will be relative to the binary dir
        file = cmStrCat(cont->BinaryDir, '/', sourceFile);
      }
      file = cmSystemTools::CollapseFullPath(file);
      bool shouldIDoCoverage =
        this->ShouldIDoCoverage(file, cont->SourceDir, cont->BinaryDir);
      if (!shouldIDoCoverage) {
        cmCTestOptionalLog(
          this->CTest, HANDLER_VERBOSE_OUTPUT,
          ".NoDartCoverage found, so skip coverage check for: " << file
                                                                << std::endl,
          this->Quiet);
        continue;
      }

      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Doing coverage for: " << file << std::endl,
                         this->Quiet);

      coveredFiles.push_back(sourceFile);
      coveredFilesFullPath.push_back(file);

      number_files++;
      total_functions += totalFunctions;
      total_tested += functionsCalled;
      total_untested += (totalFunctions - functionsCalled);

      std::string fileName = cmSystemTools::GetFilenameName(file);
      std::string shortFileName = this->CTest->GetShortPathToFile(file);

      float cper = static_cast<float>(percentBranch + percentFunction);
      if (totalBranches > 0) {
        cper /= 2.0f;
      }
      percent_coverage += static_cast<double>(cper);
      float cmet = static_cast<float>(percentFunction + percentBranch);
      if (totalBranches > 0) {
        cmet /= 2.0f;
      }
      cmet /= 100.0f;
      tmpLog << stdline << "\n";
      tmpLog << fileName << "\n";
      tmpLog << "functionsCalled: " << functionsCalled / 100 << "\n";
      tmpLog << "totalFunctions: " << totalFunctions / 100 << "\n";
      tmpLog << "percentFunction: " << percentFunction << "\n";
      tmpLog << "branchCovered: " << branchCovered << "\n";
      tmpLog << "totalBranches: " << totalBranches << "\n";
      tmpLog << "percentBranch: " << percentBranch << "\n";
      tmpLog << "percentCoverage: " << percent_coverage << "\n";
      tmpLog << "coverage metric: " << cmet << "\n";
      xml.StartElement("File");
      xml.Attribute("Name", sourceFile);
      xml.Attribute("FullPath", shortFileName);
      xml.Attribute("Covered", cmet > 0 ? "true" : "false");
      xml.Element("BranchesTested", branchCovered);
      xml.Element("BranchesUnTested", totalBranches - branchCovered);
      xml.Element("FunctionsTested", functionsCalled);
      xml.Element("FunctionsUnTested", totalFunctions - functionsCalled);
      // Hack for conversion of function to loc assume a function
      // has 100 lines of code
      xml.Element("LOCTested", functionsCalled * 100);
      xml.Element("LOCUnTested", (totalFunctions - functionsCalled) * 100);
      xml.Element("PercentCoverage", cper);
      xml.Element("CoverageMetric", cmet);
      this->WriteXMLLabels(xml, shortFileName);
      xml.EndElement(); // File
    }
  }
  std::string end_time = this->CTest->CurrentTime();
  xml.Element("LOCTested", total_tested);
  xml.Element("LOCUntested", total_untested);
  xml.Element("LOC", total_functions);
  xml.Element("PercentCoverage", SAFEDIV(percent_coverage, number_files));
  xml.Element("EndDateTime", end_time);
  xml.Element("EndTime", std::chrono::system_clock::now());
  xml.Element("ElapsedMinutes",
              std::chrono::duration_cast<std::chrono::minutes>(
                std::chrono::steady_clock::now() - elapsed_time_start)
                .count());
  xml.EndElement(); // Coverage
  this->CTest->EndXML(xml);

  // Now create the coverage information for each file
  return this->RunBullseyeCoverageBranch(cont, coveredFileNames, coveredFiles,
                                         coveredFilesFullPath);
}